

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.cpp
# Opt level: O2

void __thiscall HighsLp::userBoundScale(HighsLp *this,HighsInt user_bound_scale)

{
  pointer pdVar1;
  pointer pdVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  double dVar7;
  
  iVar6 = user_bound_scale - this->user_bound_scale_;
  if (iVar6 != 0) {
    dVar7 = ldexp(1.0,iVar6);
    iVar6 = this->num_col_;
    pdVar1 = (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar4 = 0; lVar4 < iVar6; lVar4 = lVar4 + 1) {
      pdVar1[lVar4] = pdVar1[lVar4] * dVar7;
      pdVar2[lVar4] = pdVar2[lVar4] * dVar7;
    }
    pdVar1 = (this->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (this->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = 0;
    uVar3 = (ulong)(uint)this->num_row_;
    if (this->num_row_ < 1) {
      uVar3 = uVar5;
    }
    for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      pdVar1[uVar5] = pdVar1[uVar5] * dVar7;
      pdVar2[uVar5] = pdVar2[uVar5] * dVar7;
    }
    this->user_bound_scale_ = user_bound_scale;
  }
  return;
}

Assistant:

void HighsLp::userBoundScale(const HighsInt user_bound_scale) {
  const HighsInt dl_user_bound_scale =
      user_bound_scale - this->user_bound_scale_;
  if (!dl_user_bound_scale) return;
  double dl_user_bound_scale_value = std::pow(2, dl_user_bound_scale);
  for (HighsInt iCol = 0; iCol < this->num_col_; iCol++) {
    this->col_lower_[iCol] *= dl_user_bound_scale_value;
    this->col_upper_[iCol] *= dl_user_bound_scale_value;
  }
  for (HighsInt iRow = 0; iRow < this->num_row_; iRow++) {
    this->row_lower_[iRow] *= dl_user_bound_scale_value;
    this->row_upper_[iRow] *= dl_user_bound_scale_value;
  }
  // Record the current user bound scaling applied to the LP
  this->user_bound_scale_ = user_bound_scale;
}